

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::CaseStatementSyntax::setChild
          (CaseStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00534cc0 + *(int *)(&DAT_00534cc0 + index * 4)))();
  return;
}

Assistant:

void CaseStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: uniqueOrPriority = child.token(); return;
        case 3: caseKeyword = child.token(); return;
        case 4: openParen = child.token(); return;
        case 5: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 6: closeParen = child.token(); return;
        case 7: matchesOrInside = child.token(); return;
        case 8: items = child.node()->as<SyntaxList<CaseItemSyntax>>(); return;
        case 9: endcase = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}